

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O0

int __thiscall crnlib::pixel_packer::init(pixel_packer *this,EVP_PKEY_CTX *ctx)

{
  pixel_packer *extraout_RAX;
  uint in_ECX;
  uint in_EDX;
  uint uVar1;
  byte in_R8B;
  uint local_3c;
  uint local_30;
  uint local_2c;
  uint i_1;
  uint i;
  bool reversed_local;
  int pixel_stride_local;
  uint bits_per_comp_local;
  uint num_comps_local;
  pixel_packer *this_local;
  
  uVar1 = (uint)ctx;
  clear(this);
  if ((((uVar1 == 0) || (4 < uVar1)) || (in_EDX == 0)) || (0x20 < in_EDX)) {
    this_local._7_1_ = 0;
    this = extraout_RAX;
  }
  else {
    for (local_2c = 0; local_2c < uVar1; local_2c = local_2c + 1) {
      this->m_comp_size[local_2c] = in_EDX;
      this->m_comp_ofs[local_2c] = local_2c * in_EDX;
      if ((in_R8B & 1) != 0) {
        this->m_comp_ofs[local_2c] = (uVar1 - 1) * in_EDX - this->m_comp_ofs[local_2c];
      }
    }
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      this->m_comp_max[local_30] = (int)(1L << ((byte)this->m_comp_size[local_30] & 0x3f)) - 1;
    }
    local_3c = in_ECX;
    if ((int)in_ECX < 0) {
      local_3c = uVar1 * in_EDX + 7 >> 3;
    }
    this->m_pixel_stride = local_3c;
    this_local._7_1_ = 1;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool init(uint num_comps, uint bits_per_comp, int pixel_stride = -1, bool reversed = false)
        {
            clear();

            if ((num_comps < 1) || (num_comps > 4) || (bits_per_comp < 1) || (bits_per_comp > 32))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            for (uint i = 0; i < num_comps; i++)
            {
                m_comp_size[i] = bits_per_comp;
                m_comp_ofs[i] = i * bits_per_comp;
                if (reversed)
                {
                    m_comp_ofs[i] = ((num_comps - 1) * bits_per_comp) - m_comp_ofs[i];
                }
            }

            for (uint i = 0; i < 4; i++)
            {
                m_comp_max[i] = static_cast<uint32>((1ULL << m_comp_size[i]) - 1ULL);
            }

            m_pixel_stride = (pixel_stride >= 0) ? pixel_stride : (num_comps * bits_per_comp + 7) / 8;

            return true;
        }